

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
::rebalance_or_split
          (btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
           *this,iterator *iter)

{
  size_type sVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  bVar4;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  *pbVar5;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  *pbVar6;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  *pbVar7;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  *pbVar8;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  *pbVar9;
  int iVar10;
  ulong uVar11;
  char *__function;
  byte bVar12;
  int i;
  long lVar13;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  bVar14;
  uint uVar15;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  bVar16;
  size_type sVar17;
  allocator_type *in_R9;
  long lVar18;
  ulong uVar19;
  size_type sVar20;
  bool bVar21;
  iterator parent_iter;
  iterator local_40;
  
  pbVar9 = iter->node;
  if (((ulong)pbVar9 & 7) != 0) goto LAB_001705f2;
  bVar4 = pbVar9[0xb];
  pbVar7 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
            *)(ulong)(byte)bVar4;
  bVar16 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
            )0xf;
  if (bVar4 != (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                )0x0) {
    bVar16 = bVar4;
  }
  if (pbVar9[10] != bVar16) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb53,
                  "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                 );
  }
  if (pbVar9[10] !=
      (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
       )0xf) {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb54,
                  "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                 );
  }
  pbVar8 = *(btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
             **)pbVar9;
  if (pbVar9 == (this->root_).
                super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                .
                super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*,_false>
                ._M_head_impl) {
    pbVar8 = new_internal_node(this,pbVar8);
    btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
    ::init_child(pbVar8,0,(this->root_).
                          super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                          .
                          super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                          .
                          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                          .
                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*,_false>
                          ._M_head_impl);
    (this->root_).
    super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*,_false>
    ._M_head_impl = pbVar8;
    pbVar9 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
             ::child(pbVar8,0);
    if (((ulong)pbVar9 & 7) != 0) goto LAB_001705f2;
    if ((pbVar9[0xb] !=
         (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
          )0x0) &&
       (pbVar9 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                 ::child(pbVar8,0), pbVar9 != this->rightmost_)) {
      __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xba0,
                    "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                   );
    }
    goto LAB_00170247;
  }
  if ((ulong)(byte)pbVar9[8] == 0) goto LAB_00170161;
  pbVar5 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
           ::child(pbVar8,(ulong)(byte)pbVar9[8] - 1);
  if (((ulong)pbVar5 & 7) != 0) goto LAB_001705f2;
  if ((pbVar5[0xb] !=
       (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
        )0x0) &&
     (pbVar5[0xb] !=
      (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
       )0xf)) {
    __assert_fail("left->max_count() == kNodeValues",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb5c,
                  "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                 );
  }
  bVar4 = pbVar5[10];
  if ((ulong)(byte)bVar4 < 0xf) {
    bVar12 = (byte)(0xfU - (char)bVar4) >> (iter->position < 0xf);
    sVar17 = 1;
    if (1 < bVar12) {
      sVar17 = (size_type)bVar12;
    }
    bVar16 = SUB81(sVar17,0);
    pbVar9 = iter->node;
    iVar10 = (int)sVar17;
    if ((iter->position < iVar10) &&
       (pbVar7 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                  *)(ulong)(iVar10 + (uint)(byte)bVar4), 0xe < (byte)(iVar10 + (uint)(byte)bVar4)))
    goto LAB_00170161;
    if (((ulong)pbVar9 & 7) == 0) {
      uVar19 = *(ulong *)pbVar5;
      if (uVar19 != *(ulong *)pbVar9) {
        __assert_fail("parent() == right->parent()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x87f,
                      "void phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                     );
      }
      if ((byte)pbVar5[8] + 1 != (uint)(byte)pbVar9[8]) {
        __assert_fail("position() + 1 == right->position()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x880,
                      "void phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                     );
      }
      if ((byte)pbVar9[10] < (byte)bVar4) {
        __assert_fail("right->count() >= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x881,
                      "void phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                     );
      }
      if ((byte)pbVar9[10] < (byte)bVar16) {
        __assert_fail("to_move <= right->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x883,
                      "void phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                     );
      }
      if ((uVar19 & 7) == 0) {
        puVar2 = (undefined8 *)(uVar19 + 0x10 + (ulong)(byte)pbVar5[8] * 0x10);
        uVar3 = puVar2[1];
        *(undefined8 *)(pbVar5 + (ulong)(byte)bVar4 * 0x10 + 0x10) = *puVar2;
        *(undefined8 *)(pbVar5 + (ulong)(byte)bVar4 * 0x10 + 0x10 + 8) = uVar3;
        btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
        ::uninitialized_move_n(pbVar9,(ulong)(iVar10 - 1),0,(ulong)(byte)bVar4 + 1,pbVar5,in_R9);
        uVar19 = *(ulong *)pbVar5;
        if ((uVar19 & 7) == 0) {
          bVar4 = pbVar5[8];
          lVar18 = (ulong)(iVar10 - 1) * 0x10;
          *(undefined8 *)(uVar19 + 0x10 + (ulong)(byte)bVar4 * 0x10) =
               *(undefined8 *)(pbVar9 + lVar18 + 0x10);
          *(undefined8 *)(uVar19 + 0x18 + (ulong)(byte)bVar4 * 0x10) =
               *(undefined8 *)(pbVar9 + lVar18 + 0x18);
          bVar4 = pbVar9[10];
          if (bVar16 != bVar4) {
            pbVar7 = pbVar9;
            do {
              pbVar6 = pbVar7 + 0x10;
              pbVar8 = pbVar6 + (uint)(iVar10 << 4);
              *(undefined8 *)pbVar6 = *(undefined8 *)pbVar8;
              *(undefined8 *)(pbVar7 + 0x18) = *(undefined8 *)(pbVar8 + 8);
              pbVar7 = pbVar6;
            } while (pbVar8 + 0x10 != pbVar9 + (ulong)(byte)bVar4 * 0x10 + 0x10);
          }
          if (pbVar5[0xb] ==
              (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
               )0x0) {
            sVar20 = 0;
            do {
              bVar4 = pbVar5[10];
              sVar1 = sVar20 + 1;
              pbVar7 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                       ::child(pbVar9,sVar20);
              btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
              ::init_child(pbVar5,(int)sVar20 + (uint)(byte)bVar4 + 1,pbVar7);
              sVar20 = sVar1;
            } while (sVar17 != sVar1);
            if ((byte)bVar16 <= (byte)pbVar9[10]) {
              lVar18 = 0;
              do {
                sVar20 = sVar17 + lVar18;
                bVar4 = pbVar9[0xb];
                if (pbVar9[0xb] ==
                    (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                     )0x0) {
                  bVar4 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                           )0xf;
                }
                if ((int)(uint)(byte)bVar4 < (int)sVar20) {
                  __assert_fail("i + to_move <= right->max_count()",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0x89c,
                                "void phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                               );
                }
                pbVar7 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                         ::child(pbVar9,sVar20);
                btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                ::init_child(pbVar9,(int)lVar18,pbVar7);
                btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                ::mutable_child(pbVar9,sVar20);
                bVar21 = lVar18 < (long)((byte)pbVar9[10] - sVar17);
                lVar18 = lVar18 + 1;
              } while (bVar21);
            }
          }
          pbVar5[10] = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                        )((char)pbVar5[10] + (char)bVar16);
          pbVar9[10] = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                        )((char)pbVar9[10] - (char)bVar16);
          pbVar9 = iter->node;
          if (((ulong)pbVar9 & 7) == 0) {
            bVar4 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                     )0xf;
            if (pbVar9[0xb] !=
                (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                 )0x0) {
              bVar4 = pbVar9[0xb];
            }
            if ((uint)(byte)bVar4 - (uint)(byte)pbVar9[10] == iVar10) {
              iVar10 = iter->position - iVar10;
              iter->position = iVar10;
              if (iVar10 < 0) {
                iter->position = (uint)(byte)pbVar5[10] + iVar10 + 1;
                iter->node = pbVar5;
                pbVar9 = pbVar5;
              }
              bVar4 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                       )0xf;
              if (pbVar9[0xb] !=
                  (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                   )0x0) {
                bVar4 = pbVar9[0xb];
              }
              if ((byte)pbVar9[10] < (byte)bVar4) {
                return;
              }
              __assert_fail("node->count() < node->max_count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb70,
                            "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                           );
            }
            __assert_fail("node->max_count() - node->count() == to_move",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb69,
                          "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                         );
          }
          goto LAB_001705f2;
        }
      }
      goto LAB_0017069f;
    }
LAB_00170685:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  else {
    pbVar9 = iter->node;
LAB_00170161:
    if ((((ulong)pbVar9 & 7) == 0) && (((ulong)pbVar8 & 7) == 0)) {
      if ((byte)pbVar9[8] < (byte)pbVar8[10]) {
        pbVar9 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                 ::child(pbVar8,(ulong)(byte)pbVar9[8] + 1);
        if (((ulong)pbVar9 & 7) != 0) goto LAB_001705f2;
        if ((pbVar9[0xb] !=
             (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
              )0x0) &&
           (pbVar9[0xb] !=
            (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
             )0xf)) {
          __assert_fail("right->max_count() == kNodeValues",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb79,
                        "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                       );
        }
        bVar4 = pbVar9[10];
        if ((byte)bVar4 < 0xf) {
          bVar12 = (byte)(0xfU - (char)bVar4) >> (0 < iter->position);
          uVar15 = 1;
          if (1 < bVar12) {
            uVar15 = (uint)bVar12;
          }
          pbVar5 = iter->node;
          if (((ulong)pbVar5 & 7) != 0) goto LAB_001705f2;
          bVar16 = pbVar5[10];
          pbVar7 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                    *)(ulong)(byte)bVar16;
          if ((iter->position <= (int)((byte)bVar16 - uVar15)) || (uVar15 + (byte)bVar4 < 0xf)) {
            if (*(long *)pbVar5 != *(long *)pbVar9) {
              __assert_fail("parent() == right->parent()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ab,
                            "void phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                           );
            }
            if ((byte)pbVar5[8] + 1 != (uint)(byte)pbVar9[8]) {
              __assert_fail("position() + 1 == right->position()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ac,
                            "void phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                           );
            }
            if ((byte)bVar16 < (byte)bVar4) {
              __assert_fail("count() >= right->count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ad,
                            "void phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                           );
            }
            bVar14 = SUB41(uVar15,0);
            if ((byte)bVar16 < (byte)bVar14) {
              __assert_fail("to_move <= count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8af,
                            "void phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                           );
            }
            uVar19 = (ulong)uVar15;
            if ((byte)bVar4 < (byte)bVar14) {
              btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
              ::uninitialized_move_n(pbVar9,(ulong)(byte)bVar4,0,uVar19,pbVar9,in_R9);
              if ((*(ulong *)pbVar5 & 7) == 0) {
                sVar17 = uVar19 - 1;
                puVar2 = (undefined8 *)(*(ulong *)pbVar5 + 0x10 + (ulong)(byte)pbVar5[8] * 0x10);
                uVar3 = puVar2[1];
                *(undefined8 *)(pbVar9 + sVar17 * 0x10 + 0x10) = *puVar2;
                *(undefined8 *)(pbVar9 + sVar17 * 0x10 + 0x10 + 8) = uVar3;
                sVar20 = (size_type)(int)(~(uint)(byte)pbVar9[10] + uVar15);
                btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                ::uninitialized_move_n
                          (pbVar5,sVar20,(byte)pbVar5[10] - sVar20,(ulong)(byte)pbVar9[10],pbVar9,
                           in_R9);
                if (sVar20 != sVar17) {
                  bVar4 = pbVar5[10];
                  lVar18 = 0;
                  do {
                    pbVar7 = pbVar5 + lVar18 + ((byte)bVar4 - sVar17) * 0x10 + 0x10;
                    *(undefined8 *)(pbVar9 + lVar18 + 0x10) = *(undefined8 *)pbVar7;
                    *(undefined8 *)(pbVar9 + lVar18 + 0x18) = *(undefined8 *)(pbVar7 + 8);
                    lVar18 = lVar18 + 0x10;
                  } while (pbVar7 + 0x10 != pbVar5 + ((byte)bVar4 - sVar20) * 0x10 + 0x10);
                }
LAB_001704d6:
                uVar11 = *(ulong *)pbVar5;
                if ((uVar11 & 7) == 0) {
                  bVar4 = pbVar5[8];
                  lVar18 = ((byte)pbVar5[10] - uVar19) * 0x10;
                  *(undefined8 *)(uVar11 + 0x10 + (ulong)(byte)bVar4 * 0x10) =
                       *(undefined8 *)(pbVar5 + lVar18 + 0x10);
                  *(undefined8 *)(uVar11 + 0x18 + (ulong)(byte)bVar4 * 0x10) =
                       *(undefined8 *)(pbVar5 + lVar18 + 0x18);
                  if (pbVar5[0xb] ==
                      (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                       )0x0) {
                    sVar17 = (size_type)(byte)pbVar9[10];
                    do {
                      pbVar7 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                               ::child(pbVar9,sVar17);
                      btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                      ::init_child(pbVar9,(int)sVar17 + (uint)bVar12 + (uint)(bVar12 == 0),pbVar7);
                      btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                      ::mutable_child(pbVar9,sVar17);
                      bVar21 = sVar17 != 0;
                      sVar17 = sVar17 - 1;
                    } while (bVar21);
                    iVar10 = 1 - uVar15;
                    i = 0;
                    do {
                      pbVar7 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                               ::child(pbVar5,(long)(int)((uint)(byte)pbVar5[10] + iVar10));
                      btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                      ::init_child(pbVar9,i,pbVar7);
                      btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                      ::mutable_child(pbVar5,(long)(int)((uint)(byte)pbVar5[10] + iVar10));
                      iVar10 = iVar10 + 1;
                      i = i + 1;
                    } while (iVar10 != 1);
                  }
                  pbVar5[10] = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                                )((char)pbVar5[10] - (char)bVar14);
                  pbVar9[10] = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                                )((char)pbVar9[10] + (char)bVar14);
                  pbVar7 = iter->node;
                  if (((ulong)pbVar7 & 7) == 0) {
                    if ((int)(uint)(byte)pbVar7[10] < iter->position) {
                      iter->position = iter->position + ~(uint)(byte)pbVar7[10];
                      iter->node = pbVar9;
                      pbVar7 = pbVar9;
                    }
                    bVar4 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                             )0xf;
                    if (pbVar7[0xb] !=
                        (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                         )0x0) {
                      bVar4 = pbVar7[0xb];
                    }
                    if ((byte)pbVar7[10] < (byte)bVar4) {
                      return;
                    }
                    __assert_fail("node->count() < node->max_count()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                  ,0xb8b,
                                  "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                                 );
                  }
                  goto LAB_001705f2;
                }
              }
            }
            else {
              btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
              ::uninitialized_move_n
                        (pbVar9,uVar19,(long)(int)((byte)bVar4 - uVar15),(ulong)(byte)bVar4,pbVar9,
                         in_R9);
              bVar4 = pbVar9[10];
              if (((byte)bVar14 < (byte)bVar4) && (-1 < (int)(~uVar15 + (uint)(byte)bVar4))) {
                pbVar7 = pbVar9 + (ulong)(byte)bVar4 * 0x10;
                uVar11 = (ulong)(~uVar15 + (uint)(byte)bVar4) * 0x10 + 0x20;
                do {
                  *(undefined8 *)pbVar7 = *(undefined8 *)(pbVar9 + (uVar11 - 0x10));
                  *(undefined8 *)(pbVar7 + 8) = *(undefined8 *)(pbVar9 + (uVar11 - 8));
                  pbVar7 = pbVar7 + -0x10;
                  uVar11 = uVar11 - 0x10;
                } while (0x1f < uVar11);
              }
              uVar11 = *(ulong *)pbVar5;
              if ((uVar11 & 7) == 0) {
                bVar4 = pbVar5[8];
                lVar18 = uVar19 - 1;
                *(undefined8 *)(pbVar9 + lVar18 * 0x10 + 0x10) =
                     *(undefined8 *)(uVar11 + 0x10 + (ulong)(byte)bVar4 * 0x10);
                *(undefined8 *)(pbVar9 + lVar18 * 0x10 + 0x18) =
                     *(undefined8 *)(uVar11 + 0x18 + (ulong)(byte)bVar4 * 0x10);
                if (lVar18 != 0) {
                  bVar4 = pbVar5[10];
                  lVar13 = 0;
                  do {
                    pbVar7 = pbVar5 + lVar13 + ((ulong)(byte)bVar4 - lVar18) * 0x10 + 0x10;
                    *(undefined8 *)(pbVar9 + lVar13 + 0x10) = *(undefined8 *)pbVar7;
                    *(undefined8 *)(pbVar9 + lVar13 + 0x18) = *(undefined8 *)(pbVar7 + 8);
                    lVar13 = lVar13 + 0x10;
                  } while (pbVar7 + 0x10 != pbVar5 + (ulong)(byte)bVar4 * 0x10 + 0x10);
                }
                goto LAB_001704d6;
              }
            }
LAB_0017069f:
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
            ;
            goto LAB_00170607;
          }
        }
      }
      if ((pbVar8[0xb] !=
           (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
            )0x0) &&
         (pbVar8[0xb] !=
          (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
           )0xf)) {
        __assert_fail("parent->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb93,
                      "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>]"
                     );
      }
      if (pbVar8[10] ==
          (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
           )0xf) {
        pbVar9 = iter->node;
        if (((ulong)pbVar9 & 7) != 0) goto LAB_00170685;
        pbVar7 = *(btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                   **)pbVar9;
        local_40.position = (int)(byte)pbVar9[8];
        local_40.node = pbVar7;
        rebalance_or_split(this,&local_40);
      }
LAB_00170247:
      if (((ulong)iter->node & 7) == 0) {
        if (iter->node[0xb] ==
            (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
             )0x0) {
          pbVar9 = new_internal_node(this,pbVar8);
          btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
          ::split(iter->node,iter->position,pbVar9,(allocator_type *)pbVar7);
        }
        else {
          pbVar9 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                    *)Allocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>>
                                (&(this->root_).
                                  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                                  .
                                  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                                  .
                                  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                                  ._M_head_impl,0x100);
          if (((ulong)pbVar9 & 7) != 0) {
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
            ;
            goto LAB_00170607;
          }
          *(btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
            **)pbVar9 = pbVar8;
          *(undefined4 *)(pbVar9 + 8) = 0xf000000;
          btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
          ::split(iter->node,iter->position,pbVar9,(allocator_type *)pbVar7);
          if (this->rightmost_ == iter->node) {
            this->rightmost_ = pbVar9;
          }
        }
        if (((ulong)iter->node & 7) == 0) {
          bVar4 = iter->node[10];
          if ((int)(uint)(byte)bVar4 < iter->position) {
            iter->position = iter->position + ~(uint)(byte)bVar4;
            iter->node = pbVar9;
          }
          return;
        }
      }
    }
LAB_001705f2:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
  }
LAB_00170607:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }